

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode)

{
  undefined2 uVar1;
  LodePNGColorType LVar2;
  undefined2 uVar3;
  byte bVar4;
  byte g_00;
  byte bVar5;
  LodePNGColorMode *mode_00;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  undefined8 in_R11;
  ulong uVar15;
  undefined7 uVar16;
  byte bVar17;
  size_t sVar18;
  bool bVar19;
  bool bVar20;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  byte local_109;
  byte local_108;
  byte local_107;
  byte local_106;
  byte local_105;
  uint local_104;
  uchar *local_100;
  ulong local_f8;
  uint local_ec;
  ulong local_e8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  LodePNGColorMode *local_c8;
  size_t local_c0;
  ColorTree tree;
  
  local_f8 = (ulong)(w * h);
  LVar2 = mode->colortype;
  local_100 = in;
  uVar6 = lodepng_can_have_alpha(mode);
  uVar7 = lodepng_get_bpp(mode);
  local_109 = uVar7 == 1;
  local_104 = 2;
  if (8 < uVar7) {
    local_104 = 0x101;
  }
  if (8 >= uVar7 && !(bool)local_109) {
    if (uVar7 == 2) {
      local_104 = 4;
    }
    else {
      local_104 = 0x100;
      if (uVar7 == 4) {
        local_104 = 0x10;
      }
    }
  }
  uVar12 = (uint)((LVar2 & ~LCT_GREY_ALPHA) == LCT_GREY);
  uVar6 = uVar6 ^ 1;
  color_tree_init(&tree);
  if (mode->bitdepth == 0x10) {
    sVar18 = 0;
    do {
      if (local_f8 == sVar18) goto LAB_00115464;
      getPixelColorRGBA16(&r,&g,&b,&a,local_100,sVar18,mode);
    } while ((((r & 0xff) == r >> 8) && ((g & 0xff) == g >> 8)) &&
            (((b & 0xff) == b >> 8 && (sVar18 = sVar18 + 1, (a & 0xff) == a >> 8))));
    r = 0;
    g = 0;
    b = 0;
    a = 0;
    profile->bits = 0x10;
    for (sVar18 = 0; local_f8 != sVar18; sVar18 = sVar18 + 1) {
      getPixelColorRGBA16(&r,&g,&b,&a,local_100,sVar18,mode);
      if (uVar12 == 0) {
        if (r != g) {
LAB_00115318:
          profile->colored = 1;
          goto LAB_00115321;
        }
        bVar20 = false;
        uVar12 = 0;
        if (r != b) goto LAB_00115318;
      }
      else {
LAB_00115321:
        bVar20 = true;
        uVar12 = 1;
      }
      if (uVar6 == 0) {
        if ((r == profile->key_r) && (g == profile->key_g)) {
          bVar19 = b == profile->key_b;
        }
        else {
          bVar19 = false;
        }
        if (a == 0xffff) {
          uVar6 = 0;
          if ((bool)(profile->key != 0 & bVar19)) goto LAB_001153b5;
        }
        else {
          if ((a != 0) || (!(bool)(profile->key == 0 | bVar19))) {
LAB_001153b5:
            profile->alpha = 1;
            profile->key = 0;
            goto LAB_001153c2;
          }
          uVar6 = 0;
          if (profile->key == 0 && profile->alpha == 0) {
            profile->key = 1;
            profile->key_r = r;
            profile->key_g = g;
            profile->key_b = b;
          }
        }
      }
      else {
LAB_001153c2:
        uVar6 = 1;
        if (bVar20) break;
      }
    }
    if ((profile->key != 0) && (profile->alpha == 0)) {
      for (sVar18 = 0; local_f8 != sVar18; sVar18 = sVar18 + 1) {
        getPixelColorRGBA16(&r,&g,&b,&a,local_100,sVar18,mode);
        if ((((a != 0) && (r == profile->key_r)) && (g == profile->key_g)) && (b == profile->key_b))
        {
          profile->alpha = 1;
          profile->key = 0;
        }
      }
    }
  }
  else {
LAB_00115464:
    uVar10 = 0;
    r = r & 0xff00;
    g = g & 0xff00;
    b = b & 0xff00;
    a = a & 0xff00;
    sVar18 = 0;
    local_d4 = uVar7;
    local_c8 = mode;
    do {
      uVar7 = local_d4;
      uVar11 = 1;
      if (local_f8 == sVar18) break;
      local_e8 = uVar10;
      local_c0 = sVar18;
      getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,local_100,sVar18,local_c8);
      uVar13 = profile->bits;
      bVar14 = (byte)r;
      if ((local_109 & 1) == 0 && uVar13 < 8) {
        uVar8 = uVar11;
        if ((1 < (byte)((byte)r + 1)) && (uVar8 = 8, (byte)r % 0x11 == 0)) {
          uVar8 = (uint)((byte)r % 0x55 != 0) * 2 + 2;
        }
        if (uVar13 < uVar8) {
          profile->bits = uVar8;
          uVar13 = uVar8;
        }
      }
      local_109 = uVar7 <= uVar13;
      uVar15 = CONCAT71((int7)((ulong)in_R11 >> 8),1);
      g_00 = (byte)g;
      bVar4 = (byte)b;
      local_cc = uVar11;
      uVar7 = uVar13;
      if (uVar12 == 0) {
        if ((byte)r == (byte)g) {
          uVar15 = 0;
          local_cc = 0;
          if ((byte)r == (byte)b) goto LAB_00115587;
        }
        profile->colored = 1;
        uVar16 = (undefined7)(uVar15 >> 8);
        uVar15 = CONCAT71(uVar16,1);
        local_cc = 1;
        if (uVar13 < 8) {
          profile->bits = 8;
          uVar7 = 8;
          uVar15 = CONCAT71(uVar16,1);
        }
      }
LAB_00115587:
      bVar5 = (byte)a;
      if (uVar6 == 0) {
        if ((profile->key_r == (r & 0xff)) && (profile->key_g == (g & 0xff))) {
          bVar20 = profile->key_b == (b & 0xff);
        }
        else {
          bVar20 = false;
        }
        if ((byte)a == 0xff) {
          bVar17 = 0;
          local_d0 = 0;
          if ((bool)(profile->key != 0 & bVar20)) {
            profile->alpha = 1;
            profile->key = 0;
            goto joined_r0x00115788;
          }
        }
        else {
          if (((byte)a != 0) || (!(bool)(profile->key == 0 | bVar20))) {
            profile->alpha = 1;
            profile->key = 0;
joined_r0x00115788:
            if (uVar7 < 8) {
              profile->bits = 8;
            }
            goto LAB_00115593;
          }
          bVar17 = 0;
          local_d0 = 0;
          if (profile->key == 0 && profile->alpha == 0) {
            profile->key = 1;
            profile->key_r = r & 0xff;
            profile->key_g = g & 0xff;
            profile->key_b = b & 0xff;
            bVar17 = 0;
            local_d0 = 0;
          }
        }
      }
      else {
LAB_00115593:
        bVar17 = 1;
        local_d0 = uVar11;
      }
      uVar10 = 1;
      if ((uint)local_e8 == 0) {
        local_106 = (byte)r;
        local_105 = (byte)g;
        local_d8 = (uint)(byte)b;
        local_dc = (uint)(byte)a;
        local_e8 = CONCAT44(local_e8._4_4_,uVar13);
        local_ec = (uint)uVar15;
        iVar9 = color_tree_get(&tree,(byte)r,(byte)g,(byte)b,(byte)a);
        uVar15 = (ulong)local_ec;
        uVar10 = 0;
        uVar13 = (uint)local_e8;
        if (iVar9 < 0) {
          local_108 = bVar5;
          local_107 = bVar4;
          color_tree_add(&tree,bVar14,g_00,(uchar)local_d8,(uchar)local_dc,profile->numcolors);
          uVar6 = profile->numcolors;
          if ((ulong)uVar6 < 0x100) {
            uVar10 = (ulong)(uVar6 * 4);
            profile->palette[(ulong)uVar6 * 4] = local_106;
            profile->palette[uVar10 + 1] = local_105;
            profile->palette[uVar10 + 2] = local_107;
            profile->palette[uVar10 + 3] = local_108;
          }
          profile->numcolors = uVar6 + 1;
          uVar10 = (ulong)(local_104 <= uVar6 + 1);
          uVar15 = (ulong)local_ec;
          uVar13 = (uint)local_e8;
        }
      }
      bVar14 = (byte)uVar15 & bVar17 & (byte)uVar10;
      in_R11 = CONCAT71((int7)(uVar15 >> 8),bVar14);
      sVar18 = local_c0 + 1;
      uVar6 = local_d0;
      uVar12 = local_cc;
    } while ((bVar14 != 1) || (uVar13 < local_d4));
    mode_00 = local_c8;
    if ((profile->key != 0) && (profile->alpha == 0)) {
      for (sVar18 = 0; local_f8 != sVar18; sVar18 = sVar18 + 1) {
        getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,local_100,sVar18,mode_00)
        ;
        if (((((byte)a != '\0') && (profile->key_r == (r & 0xff))) && (profile->key_g == (g & 0xff))
            ) && (profile->key_b == (b & 0xff))) {
          profile->alpha = 1;
          profile->key = 0;
          if (profile->bits < 8) {
            profile->bits = 8;
          }
        }
      }
    }
    uVar1 = profile->key_r;
    uVar3 = profile->key_g;
    profile->key_r = uVar1 * 0x101;
    profile->key_g = uVar3 * 0x101;
    profile->key_b = (short)*(undefined4 *)&profile->key_b * 0x101;
  }
  color_tree_cleanup(&tree);
  return 0;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  unsigned colored_done = lodepng_is_greyscale_type(mode) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode);
  unsigned bits_done = bpp == 1 ? 1 : 0;
  unsigned maxnumcolors = 257;
  unsigned sixteen = 0;
  if(bpp <= 8) maxnumcolors = bpp == 1 ? 2 : (bpp == 2 ? 4 : (bpp == 4 ? 16 : 256));

  color_tree_init(&tree);

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode->bitdepth == 16)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        sixteen = 1;
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    profile->bits = 16;
    bits_done = numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
      }
    }
  }
  else /* < 16-bit */
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}